

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O3

void ReadFromStream(AddrMan *addr,DataStream *ssPeers)

{
  CChainParams *pCVar1;
  runtime_error *this;
  size_t in_RCX;
  long in_FS_OFFSET;
  MessageStartChars pchMsgTmp;
  HashVerifier<DataStream> verifier;
  int local_9c;
  HashVerifier<DataStream> local_98;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256((CSHA256 *)&local_98);
  local_98.m_source = ssPeers;
  DataStream::read(ssPeers,(int)&local_9c,(void *)0x4,in_RCX);
  CSHA256::Write((CSHA256 *)&local_98,(uchar *)&local_9c,4);
  pCVar1 = Params();
  if (local_9c == *(int *)(pCVar1->pchMessageStart)._M_elems) {
    AddrMan::Unserialize<HashVerifier<DataStream>>(addr,&local_98);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Invalid network magic number");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void ReadFromStream(AddrMan& addr, DataStream& ssPeers)
{
    DeserializeDB(ssPeers, addr, false);
}